

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t archive_read_format_cab_cleanup(archive_read *a)

{
  void *__ptr;
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  
  __ptr = a->format->data;
  pvVar1 = *(void **)((long)__ptr + 0x60);
  if (pvVar1 != (void *)0x0) {
    if (*(short *)((long)__ptr + 0x50) != 0) {
      lVar3 = 0x38;
      uVar2 = 0;
      do {
        free(*(void **)(*(long *)((long)__ptr + 0x60) + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x60;
      } while (uVar2 < *(ushort *)((long)__ptr + 0x50));
      pvVar1 = *(void **)((long)__ptr + 0x60);
    }
    free(pvVar1);
  }
  pvVar1 = *(void **)((long)__ptr + 0x68);
  if (pvVar1 != (void *)0x0) {
    if (*(short *)((long)__ptr + 0x52) != 0) {
      lVar3 = 0x18;
      uVar2 = 0;
      do {
        archive_string_free((archive_string *)(*(long *)((long)__ptr + 0x68) + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar2 < *(ushort *)((long)__ptr + 0x52));
      pvVar1 = *(void **)((long)__ptr + 0x68);
    }
    free(pvVar1);
  }
  if (*(char *)((long)__ptr + 0x180) != '\0') {
    cm_zlib_inflateEnd((z_streamp)((long)__ptr + 0x110));
  }
  if (*(long *)((long)__ptr + 0x1b8) != 0) {
    free(*(void **)(*(long *)((long)__ptr + 0x1b8) + 0x10));
    free(*(void **)(*(long *)((long)__ptr + 0x1b8) + 0x60));
    lzx_huffman_free((huffman *)(*(long *)((long)__ptr + 0x1b8) + 0x78));
    lzx_huffman_free((huffman *)(*(long *)((long)__ptr + 0x1b8) + 0x1e0));
    lzx_huffman_free((huffman *)(*(long *)((long)__ptr + 0x1b8) + 0x168));
    lzx_huffman_free((huffman *)(*(long *)((long)__ptr + 0x1b8) + 0xf0));
    free(*(void **)((long)__ptr + 0x1b8));
    *(undefined8 *)((long)__ptr + 0x1b8) = 0;
  }
  archive_wstring_free((archive_wstring *)((long)__ptr + 0x78));
  free(*(void **)((long)__ptr + 0xa0));
  free(__ptr);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_cab_cleanup(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfheader *hd = &cab->cfheader;
	int i;

	if (hd->folder_array != NULL) {
		for (i = 0; i < hd->folder_count; i++)
			free(hd->folder_array[i].cfdata.memimage);
		free(hd->folder_array);
	}
	if (hd->file_array != NULL) {
		for (i = 0; i < cab->cfheader.file_count; i++)
			archive_string_free(&(hd->file_array[i].pathname));
		free(hd->file_array);
	}
#ifdef HAVE_ZLIB_H
	if (cab->stream_valid)
		inflateEnd(&cab->stream);
#endif
	lzx_decode_free(&cab->xstrm);
	archive_wstring_free(&cab->ws);
	free(cab->uncompressed_buffer);
	free(cab);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}